

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

dicthashelement_t * dictinstall(char *name,dicthashelement_t **hashtable)

{
  uint uVar1;
  dicthashelement_t *pdVar2;
  char *pcVar3;
  
  pdVar2 = dictlookup(name,hashtable);
  if (pdVar2 == (dicthashelement_t *)0x0) {
    pdVar2 = (dicthashelement_t *)calloc(1,0x20);
    if (pdVar2 != (dicthashelement_t *)0x0) {
      pcVar3 = strdup(name);
      pdVar2->word = pcVar3;
      if (pcVar3 != (char *)0x0) {
        uVar1 = dicthash(name);
        pdVar2->next = hashtable[uVar1];
        hashtable[uVar1] = pdVar2;
        return pdVar2;
      }
    }
    pdVar2 = (dicthashelement_t *)0x0;
  }
  return pdVar2;
}

Assistant:

dicthashelement_t *dictinstall(char *name, dicthashelement_t **hashtable)
{
    dicthashelement_t  *np;
    unsigned hashval;

    if ((np = dictlookup(name, hashtable)) == NULL)
    {
        np = (dicthashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->word = strdup(name)) == NULL)
            return NULL;

        np->nphns = 0;
        hashval = dicthash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}